

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

_Bool malloc_init_hard_a0(void)

{
  _Bool _Var1;
  int iVar2;
  
  iVar2 = pthread_mutex_trylock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x48));
  if (iVar2 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&init_lock);
    init_lock.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  init_lock.field_0.field_0.prof_data.n_lock_ops =
       init_lock.field_0.field_0.prof_data.n_lock_ops + 1;
  if (init_lock.field_0.field_0.prof_data.prev_owner != (tsdn_t *)0x0) {
    init_lock.field_0.field_0.prof_data.prev_owner = (tsdn_t *)0x0;
    init_lock.field_0.witness.link.qre_prev =
         (witness_t *)(init_lock.field_0.field_0.prof_data.n_owner_switches + 1);
  }
  _Var1 = malloc_init_hard_a0_locked();
  init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x48));
  return _Var1;
}

Assistant:

static bool
malloc_init_hard_a0(void) {
	bool ret;

	malloc_mutex_lock(TSDN_NULL, &init_lock);
	ret = malloc_init_hard_a0_locked();
	malloc_mutex_unlock(TSDN_NULL, &init_lock);
	return ret;
}